

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateFastInlineMathFround(Lowerer *this,Instr *instr)

{
  Opnd *dstOpnd;
  Opnd *src1Opnd;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  
  dstOpnd = instr->m_dst;
  src1Opnd = instr->m_src1;
  if (1 < (byte)(dstOpnd->m_type - TyFloat32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x52b0,"(dst->IsFloat())","dst->IsFloat()");
    if (!bVar2) goto LAB_0054a10d;
    *puVar3 = 0;
  }
  if (1 < (byte)(src1Opnd->m_type - TyFloat32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x52b1,"(src1->IsFloat())","src1->IsFloat()");
    if (!bVar2) {
LAB_0054a10d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pIVar4 = IR::Instr::New(CVTSD2SS,dstOpnd,src1Opnd,instr->m_func);
  IR::Instr::InsertBefore(instr,pIVar4);
  LowererMD::Legalize<false>(pIVar4,false);
  if (dstOpnd->m_type == TyFloat64) {
    pIVar4 = IR::Instr::New(CVTSS2SD,dstOpnd,dstOpnd,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar4);
    LowererMD::Legalize<false>(pIVar4,false);
  }
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineMathFround(IR::Instr* instr)
{
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* dst = instr->GetDst();

    Assert(dst->IsFloat());
    Assert(src1->IsFloat());

    // This function is supposed to convert a float to the closest float32 representation.
    // However, it is a bit loose about types, which the ARM64 encoder takes issue with.
#ifdef _M_ARM64
    LowererMD::GenerateFastInlineMathFround(instr);
#else
    IR::Instr* fcvt64to32 = IR::Instr::New(LowererMD::MDConvertFloat64ToFloat32Opcode, dst, src1, instr->m_func);

    instr->InsertBefore(fcvt64to32);
    LowererMD::Legalize(fcvt64to32);

    if (dst->IsFloat64())
    {
        IR::Instr* fcvt32to64 = IR::Instr::New(LowererMD::MDConvertFloat32ToFloat64Opcode, dst, dst, instr->m_func);
        instr->InsertBefore(fcvt32to64);
        LowererMD::Legalize(fcvt32to64);
    }

    instr->Remove();
#endif
    return;
}